

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrShadingContext.cpp
# Opt level: O0

void __thiscall
rr::FragmentShadingContext::FragmentShadingContext
          (FragmentShadingContext *this,GenericVec4 *varying0,GenericVec4 *varying1,
          GenericVec4 *varying2,GenericVec4 *outputArray_,float *fragmentDepths_,int primitiveID_,
          int numFragmentOutputs_,int numSamples_,FaceType visibleFace_)

{
  float *fragmentDepths__local;
  GenericVec4 *outputArray__local;
  GenericVec4 *varying2_local;
  GenericVec4 *varying1_local;
  GenericVec4 *varying0_local;
  FragmentShadingContext *this_local;
  
  this->outputArray = outputArray_;
  this->primitiveID = primitiveID_;
  this->numFragmentOutputs = numFragmentOutputs_;
  this->numSamples = numSamples_;
  this->fragmentDepths = fragmentDepths_;
  this->visibleFace = visibleFace_;
  this->varyings[0] = varying0;
  this->varyings[1] = varying1;
  this->varyings[2] = varying2;
  return;
}

Assistant:

FragmentShadingContext::FragmentShadingContext (const GenericVec4* varying0, const GenericVec4* varying1, const GenericVec4* varying2, GenericVec4* outputArray_, float* fragmentDepths_, int primitiveID_, int numFragmentOutputs_, int numSamples_, FaceType visibleFace_)
	: outputArray			(outputArray_)
	, primitiveID			(primitiveID_)
	, numFragmentOutputs	(numFragmentOutputs_)
	, numSamples			(numSamples_)
	, fragmentDepths		(fragmentDepths_)
	, visibleFace			(visibleFace_)
{
	varyings[0] = varying0;
	varyings[1] = varying1;
	varyings[2] = varying2;
}